

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O3

void __thiscall QList<QObject_*(*)()>::resize(QList<QObject_*(*)()> *this,qsizetype size)

{
  _func_QObject_ptr **pp_Var1;
  Data *pDVar2;
  _func_QObject_ptr **pp_Var3;
  long lVar4;
  
  pDVar2 = (this->d).d;
  if (((pDVar2 == (Data *)0x0) ||
      (1 < (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) ||
     ((pDVar2->super_QArrayData).alloc -
      ((long)((long)(this->d).ptr -
             ((ulong)((long)&pDVar2[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 3) <
      size)) {
    QArrayDataPointer<QObject_*(*)()>::detachAndGrow
              (&this->d,GrowsAtEnd,size - (this->d).size,(_func_QObject_ptr ***)0x0,
               (QArrayDataPointer<QObject_*(*)()> *)0x0);
    lVar4 = (this->d).size;
  }
  else {
    lVar4 = (this->d).size;
    if (size < lVar4) goto LAB_002d6cad;
  }
  if (size <= lVar4) {
    return;
  }
  pp_Var3 = (this->d).ptr;
  pp_Var1 = pp_Var3 + lVar4;
  *pp_Var1 = (_func_QObject_ptr *)0x0;
  if (pp_Var1 + 1 != pp_Var3 + size) {
    memset(pp_Var1 + 1,0,(size * 8 + lVar4 * -8) - 8);
  }
LAB_002d6cad:
  (this->d).size = size;
  return;
}

Assistant:

void resize(qsizetype size)
    {
        resize_internal(size);
        if (size > this->size())
            d->appendInitialize(size);
    }